

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_unify(nk_rect *clip,nk_rect *a,float x0,float y0,float x1,float y1)

{
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  nk_rect *a_local;
  nk_rect *clip_local;
  
  if (a == (nk_rect *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x187f,
                  "void nk_unify(struct nk_rect *, const struct nk_rect *, float, float, float, float)"
                 );
  }
  if (clip == (nk_rect *)0x0) {
    __assert_fail("clip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1880,
                  "void nk_unify(struct nk_rect *, const struct nk_rect *, float, float, float, float)"
                 );
  }
  local_2c = x0;
  if (x0 <= a->x) {
    local_2c = a->x;
  }
  clip->x = local_2c;
  local_30 = y0;
  if (y0 <= a->y) {
    local_30 = a->y;
  }
  clip->y = local_30;
  local_34 = x1;
  if (a->x + a->w < x1) {
    local_34 = a->x + a->w;
  }
  clip->w = local_34 - clip->x;
  local_38 = y1;
  if (a->y + a->h < y1) {
    local_38 = a->y + a->h;
  }
  clip->h = local_38 - clip->y;
  if (clip->w <= 0.0) {
    local_3c = 0.0;
  }
  else {
    local_3c = clip->w;
  }
  clip->w = local_3c;
  if (clip->h <= 0.0) {
    local_40 = 0.0;
  }
  else {
    local_40 = clip->h;
  }
  clip->h = local_40;
  return;
}

Assistant:

NK_LIB void
nk_unify(struct nk_rect *clip, const struct nk_rect *a, float x0, float y0,
    float x1, float y1)
{
    NK_ASSERT(a);
    NK_ASSERT(clip);
    clip->x = NK_MAX(a->x, x0);
    clip->y = NK_MAX(a->y, y0);
    clip->w = NK_MIN(a->x + a->w, x1) - clip->x;
    clip->h = NK_MIN(a->y + a->h, y1) - clip->y;
    clip->w = NK_MAX(0, clip->w);
    clip->h = NK_MAX(0, clip->h);
}